

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodemv.c
# Opt level: O2

void av1_encode_dv(aom_writer *w,MV *mv,MV *ref,nmv_context *mvctx)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  
  sVar1 = mv->row;
  sVar2 = mv->col;
  sVar3 = ref->row;
  sVar4 = ref->col;
  sVar5 = sVar2 - sVar4;
  aom_write_symbol(w,(uint)(sVar5 != 0) + (uint)(sVar1 != sVar3) * 2,mvctx->joints_cdf,4);
  if (sVar1 != sVar3) {
    encode_mv_component(w,(int)(short)(sVar1 - sVar3),mvctx->comps,-1);
  }
  if (sVar2 != sVar4) {
    encode_mv_component(w,(int)sVar5,mvctx->comps + 1,-1);
    return;
  }
  return;
}

Assistant:

void av1_encode_dv(aom_writer *w, const MV *mv, const MV *ref,
                   nmv_context *mvctx) {
  // DV and ref DV should not have sub-pel.
  assert((mv->col & 7) == 0);
  assert((mv->row & 7) == 0);
  assert((ref->col & 7) == 0);
  assert((ref->row & 7) == 0);
  const MV diff = { mv->row - ref->row, mv->col - ref->col };
  const MV_JOINT_TYPE j = av1_get_mv_joint(&diff);

  aom_write_symbol(w, j, mvctx->joints_cdf, MV_JOINTS);
  if (mv_joint_vertical(j))
    encode_mv_component(w, diff.row, &mvctx->comps[0], MV_SUBPEL_NONE);

  if (mv_joint_horizontal(j))
    encode_mv_component(w, diff.col, &mvctx->comps[1], MV_SUBPEL_NONE);
}